

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_File.cpp
# Opt level: O0

uint64_t axl::io::copyFile(File *srcFile,StringRef *dstFileName,uint64_t size)

{
  uint uVar1;
  char *in_RSI;
  bool result;
  File dstFile;
  File *in_stack_00000050;
  File *in_stack_00000058;
  File local_24 [3];
  char *local_18;
  uint64_t local_8;
  
  local_18 = in_RSI;
  File::File((File *)0x1a8612);
  uVar1 = File::open(local_24,local_18,0);
  if ((uVar1 & 1) == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = copyFile(in_stack_00000058,in_stack_00000050,(uint64_t)srcFile);
  }
  File::~File((File *)0x1a869e);
  return local_8;
}

Assistant:

uint64_t
copyFile(
	const io::File* srcFile,
	const sl::StringRef& dstFileName,
	uint64_t size
) {
	File dstFile;
	bool result = dstFile.open(dstFileName);
	if (!result)
		return -1;

	return copyFile(srcFile, &dstFile, size);
}